

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

int __thiscall smf::MidiEventList::linkNotePairsLIFO(MidiEventList *this)

{
  pointer *ppvVar1;
  MidiEvent *pMVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  reference this_00;
  iterator __first;
  iterator __last;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  size_type sVar11;
  reference pvVar12;
  reference ppMVar13;
  uint *puVar14;
  int local_124;
  int i_1;
  MidiEvent *noteon;
  MidiEvent *mev;
  int counter;
  int contstate;
  int conti;
  int contval;
  int contnum;
  int key;
  int channel;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  void *local_e0;
  MidiEvent **local_d8;
  __normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
  local_d0;
  int local_c4;
  undefined1 local_c0 [4];
  int i;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  oldstates;
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  contevents;
  int local_80 [2];
  pair<int,_int> local_78;
  pair<int,_int> zero;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> contmap;
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  *noteon_1;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  *__range1;
  undefined1 local_28 [8];
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  noteons;
  MidiEventList *this_local;
  
  noteons.
  super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
            *)local_28);
  std::
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
            *)local_28,0x10);
  __end1 = std::
           vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
           ::begin((vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                    *)local_28);
  noteon_1 = (vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
              *)std::
                vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                ::end((vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                       *)local_28);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_*,_std::vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>_>
                                     *)&noteon_1), bVar5) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_*,_std::vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>_>
              ::operator*(&__end1);
    std::
    vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
    ::resize(this_00,0x80);
    __gnu_cxx::
    __normal_iterator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_*,_std::vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,0x80);
  local_80[1] = 0;
  local_80[0] = 0;
  std::pair<int,_int>::pair<int,_int,_true>(&local_78,local_80 + 1,local_80);
  __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(&zero);
  __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(&zero);
  std::
  fill<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__last._M_current,&local_78);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x40);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x40);
  pvVar7->second = 0;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x41);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x41);
  pvVar7->second = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x42);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x42);
  pvVar7->second = 2;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x43);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x43);
  pvVar7->second = 3;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x44);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x44);
  pvVar7->second = 4;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x45);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x45);
  pvVar7->second = 5;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x50);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x50);
  pvVar7->second = 6;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x51);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x51);
  pvVar7->second = 7;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x52);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x52);
  pvVar7->second = 8;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x53);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x53);
  pvVar7->second = 9;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x54);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x54);
  pvVar7->second = 10;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x55);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x55);
  pvVar7->second = 0xb;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x56);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x56);
  pvVar7->second = 0xc;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x57);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x57);
  pvVar7->second = 0xd;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x58);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x58);
  pvVar7->second = 0xe;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x59);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x59);
  pvVar7->second = 0xf;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x5a);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x5a);
  pvVar7->second = 0x10;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x7a);
  pvVar7->first = 1;
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero,
                      0x7a);
  pvVar7->second = 0x11;
  ppvVar1 = &oldstates.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::vector((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
            *)ppvVar1);
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::resize((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
            *)ppvVar1,0x12);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_c0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_c0,0x12);
  for (local_c4 = 0; local_c4 < 0x12; local_c4 = local_c4 + 1) {
    pvVar8 = std::
             vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
             ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                           *)&oldstates.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_c4);
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::resize(pvVar8,0x10);
    ppvVar1 = &oldstates.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar8 = std::
             vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
             ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                           *)ppvVar1,(long)local_c4);
    local_d0._M_current =
         (MidiEvent **)
         std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::begin(pvVar8);
    pvVar8 = std::
             vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
             ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                           *)ppvVar1,(long)local_c4);
    local_d8 = (MidiEvent **)
               std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::end(pvVar8);
    local_e0 = (void *)0x0;
    std::
    fill<__gnu_cxx::__normal_iterator<smf::MidiEvent**,std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>>,decltype(nullptr)>
              (local_d0,(__normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
                         )local_d8,&local_e0);
    pvVar9 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_c0,(long)local_c4);
    std::vector<int,_std::allocator<int>_>::resize(pvVar9,0x10);
    pvVar9 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_c0,(long)local_c4);
    local_e8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar9);
    pvVar9 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_c0,(long)local_c4);
    _channel = std::vector<int,_std::allocator<int>_>::end(pvVar9);
    key = -1;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (local_e8,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_channel,
               &key);
  }
  mev._0_4_ = 0;
  for (local_124 = 0; iVar6 = getSize(this), iVar3 = (int)mev, local_124 < iVar6;
      local_124 = local_124 + 1) {
    noteon = getEvent(this,local_124);
    MidiEvent::unlinkEvent(noteon);
    bVar5 = MidiMessage::isNoteOn(&noteon->super_MidiMessage);
    if (bVar5) {
      contval = MidiMessage::getKeyNumber(&noteon->super_MidiMessage);
      contnum = MidiMessage::getChannel(&noteon->super_MidiMessage);
      pvVar10 = std::
                vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                              *)local_28,(long)contnum);
      pvVar8 = std::
               vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
               ::operator[](pvVar10,(long)contval);
      std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back(pvVar8,&noteon);
    }
    else {
      bVar5 = MidiMessage::isNoteOff(&noteon->super_MidiMessage);
      if (bVar5) {
        contval = MidiMessage::getKeyNumber(&noteon->super_MidiMessage);
        contnum = MidiMessage::getChannel(&noteon->super_MidiMessage);
        pvVar10 = std::
                  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                                *)local_28,(long)contnum);
        pvVar8 = std::
                 vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                 ::operator[](pvVar10,(long)contval);
        sVar11 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(pvVar8);
        if (sVar11 != 0) {
          pvVar10 = std::
                    vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                                  *)local_28,(long)contnum);
          pvVar8 = std::
                   vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                   ::operator[](pvVar10,(long)contval);
          ppMVar13 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::back(pvVar8);
          pMVar2 = *ppMVar13;
          pvVar10 = std::
                    vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                                  *)local_28,(long)contnum);
          pvVar8 = std::
                   vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                   ::operator[](pvVar10,(long)contval);
          std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::pop_back(pvVar8);
          MidiEvent::linkEvent(pMVar2,noteon);
          mev._0_4_ = (int)mev + 1;
        }
      }
      else {
        bVar5 = MidiMessage::isController(&noteon->super_MidiMessage);
        if (bVar5) {
          conti = MidiMessage::getP1(&noteon->super_MidiMessage);
          pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &zero,(long)conti);
          if (pvVar7->first != 0) {
            pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                     operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)&zero,(long)conti);
            counter = pvVar7->second;
            contnum = MidiMessage::getChannel(&noteon->super_MidiMessage);
            contstate = MidiMessage::getP2(&noteon->super_MidiMessage);
            mev._4_4_ = (uint)(0x3f < contstate);
            pvVar9 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_c0,(long)counter);
            pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar9,(long)contnum);
            pMVar2 = noteon;
            if ((*pvVar12 == -1) && (mev._4_4_ != 0)) {
              pvVar8 = std::
                       vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                       ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                     *)&oldstates.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (long)counter);
              ppMVar13 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::
                         operator[](pvVar8,(long)contnum);
              uVar4 = mev._4_4_;
              *ppMVar13 = pMVar2;
              pvVar9 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_c0,(long)counter);
              puVar14 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                          (pvVar9,(long)contnum);
              *puVar14 = uVar4;
            }
            else {
              pvVar9 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_c0,(long)counter);
              puVar14 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                          (pvVar9,(long)contnum);
              if (*puVar14 != mev._4_4_) {
                pvVar9 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       *)local_c0,(long)counter);
                pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar9,(long)contnum);
                pMVar2 = noteon;
                if ((*pvVar12 == 0) && (mev._4_4_ != 0)) {
                  pvVar8 = std::
                           vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                           ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                         *)&oldstates.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (long)counter);
                  ppMVar13 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::
                             operator[](pvVar8,(long)contnum);
                  uVar4 = mev._4_4_;
                  *ppMVar13 = pMVar2;
                  pvVar9 = std::
                           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         *)local_c0,(long)counter);
                  puVar14 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                              (pvVar9,(long)contnum);
                  *puVar14 = uVar4;
                }
                else {
                  pvVar9 = std::
                           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         *)local_c0,(long)counter);
                  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar9,(long)contnum)
                  ;
                  if ((*pvVar12 == 1) && (mev._4_4_ == 0)) {
                    pvVar8 = std::
                             vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                             ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                           *)&oldstates.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          (long)counter);
                    ppMVar13 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::
                               operator[](pvVar8,(long)contnum);
                    MidiEvent::linkEvent(*ppMVar13,noteon);
                    uVar4 = mev._4_4_;
                    pvVar9 = std::
                             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           *)local_c0,(long)counter);
                    puVar14 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                                (pvVar9,(long)contnum);
                    pMVar2 = noteon;
                    *puVar14 = uVar4;
                    pvVar8 = std::
                             vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                             ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                           *)&oldstates.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          (long)counter);
                    ppMVar13 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::
                               operator[](pvVar8,(long)contnum);
                    *ppMVar13 = pMVar2;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_c0);
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::~vector((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
             *)&oldstates.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&zero);
  std::
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
             *)local_28);
  return iVar3;
}

Assistant:

int MidiEventList::linkNotePairsLIFO(void) {

	// Note-on states:
	// dimension 1: MIDI channel (0-15)
	// dimension 2: MIDI key     (0-127)  (but 0 not used for note-ons)
	// dimension 3: List of active note-ons or note-offs.
	std::vector<std::vector<std::vector<MidiEvent*>>> noteons;
	noteons.resize(16);
	for (auto& noteon : noteons) {
		noteon.resize(128);
	}

	// Controller linking: The following General MIDI controller numbers are
	// also monitored for linking within the track (but not between tracks).
	// hex dec  name                                    range
	// 40  64   Hold pedal (Sustain) on/off             0..63=off  64..127=on
	// 41  65   Portamento on/off                       0..63=off  64..127=on
	// 42  66   Sustenuto Pedal on/off                  0..63=off  64..127=on
	// 43  67   Soft Pedal on/off                       0..63=off  64..127=on
	// 44  68   Legato Pedal on/off                     0..63=off  64..127=on
	// 45  69   Hold Pedal 2 on/off                     0..63=off  64..127=on
	// 50  80   General Purpose Button                  0..63=off  64..127=on
	// 51  81   General Purpose Button                  0..63=off  64..127=on
	// 52  82   General Purpose Button                  0..63=off  64..127=on
	// 53  83   General Purpose Button                  0..63=off  64..127=on
	// 54  84   Undefined on/off                        0..63=off  64..127=on
	// 55  85   Undefined on/off                        0..63=off  64..127=on
	// 56  86   Undefined on/off                        0..63=off  64..127=on
	// 57  87   Undefined on/off                        0..63=off  64..127=on
	// 58  88   Undefined on/off                        0..63=off  64..127=on
	// 59  89   Undefined on/off                        0..63=off  64..127=on
	// 5A  90   Undefined on/off                        0..63=off  64..127=on
	// 7A 122   Local Keyboard On/Off                   0..63=off  64..127=on

	// first keep track of whether the controller is an on/off switch:
	std::vector<std::pair<int, int>> contmap;
	contmap.resize(128);
	std::pair<int, int> zero(0, 0);
	std::fill(contmap.begin(), contmap.end(), zero);
	contmap[64].first  = 1;   contmap[64].second = 0;
	contmap[65].first  = 1;   contmap[65].second = 1;
	contmap[66].first  = 1;   contmap[66].second = 2;
	contmap[67].first  = 1;   contmap[67].second = 3;
	contmap[68].first  = 1;   contmap[68].second = 4;
	contmap[69].first  = 1;   contmap[69].second = 5;
	contmap[80].first  = 1;   contmap[80].second = 6;
	contmap[81].first  = 1;   contmap[81].second = 7;
	contmap[82].first  = 1;   contmap[82].second = 8;
	contmap[83].first  = 1;   contmap[83].second = 9;
	contmap[84].first  = 1;   contmap[84].second = 10;
	contmap[85].first  = 1;   contmap[85].second = 11;
	contmap[86].first  = 1;   contmap[86].second = 12;
	contmap[87].first  = 1;   contmap[87].second = 13;
	contmap[88].first  = 1;   contmap[88].second = 14;
	contmap[89].first  = 1;   contmap[89].second = 15;
	contmap[90].first  = 1;   contmap[90].second = 16;
	contmap[122].first = 1;   contmap[122].second = 17;

	// dimensions:
	// 1: mapped controller (0 to 17)
	// 2: channel (0 to 15)
	std::vector<std::vector<MidiEvent*>> contevents;
	contevents.resize(18);
	std::vector<std::vector<int>> oldstates;
	oldstates.resize(18);
	for (int i=0; i<18; i++) {
		contevents[i].resize(16);
		std::fill(contevents[i].begin(), contevents[i].end(), nullptr);
		oldstates[i].resize(16);
		std::fill(oldstates[i].begin(), oldstates[i].end(), -1);
	}

	// Now iterate through the MidiEventList keeping track of note and
	// select controller states and linking notes/controllers as needed.
	int channel;
	int key;
	int contnum;
	int contval;
	int conti;
	int contstate;
	int counter = 0;
	MidiEvent* mev;
	MidiEvent* noteon;
	for (int i=0; i<getSize(); i++) {
		mev = &getEvent(i);
		mev->unlinkEvent();
		if (mev->isNoteOn()) {
			// store the note-on to pair later with a note-off message.
			key = mev->getKeyNumber();
			channel = mev->getChannel();
			noteons[channel][key].push_back(mev);
		} else if (mev->isNoteOff()) {
			key = mev->getKeyNumber();
			channel = mev->getChannel();
			if (noteons[channel][key].size() > 0) {
				noteon = noteons[channel][key].back();
				noteons[channel][key].pop_back();
				noteon->linkEvent(mev);
				counter++;
			}
		} else if (mev->isController()) {
			contnum = mev->getP1();
			if (contmap[contnum].first) {
				conti     = contmap[contnum].second;
				channel   = mev->getChannel();
				contval   = mev->getP2();
				contstate = contval < 64 ? 0 : 1;
				if ((oldstates[conti][channel] == -1) && contstate) {
					// a newly initialized onstate was detected, so store for
					// later linking to an off state.
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if (oldstates[conti][channel] == contstate) {
					// the controller state is redundant and will be ignored.
				} else if ((oldstates[conti][channel] == 0) && contstate) {
					// controller is currently off, so store on-state for next link
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if ((oldstates[conti][channel] == 1) && (contstate == 0)) {
					// controller has just been turned off, so link to
					// stored on-message.
					contevents[conti][channel]->linkEvent(mev);
					oldstates[conti][channel] = contstate;
					// not necessary, but maybe use for something later:
					contevents[conti][channel] = mev;
				}
			}
		}
	}
	return counter;
}